

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemUtils.h
# Opt level: O2

bool __thiscall FileSystemUtils::Path::HasExtension(Path *this)

{
  ulong uVar1;
  ulong uVar2;
  char cVar3;
  
  cVar3 = (char)this + '\b';
  uVar1 = std::__cxx11::string::rfind(cVar3,0x2e);
  if ((uVar1 != 0xffffffffffffffff) &&
     (uVar2 = std::__cxx11::string::rfind(cVar3,0x2f), uVar2 == 0xffffffffffffffff || uVar2 <= uVar1
     )) {
    uVar2 = std::__cxx11::string::rfind(cVar3,0x5c);
    return uVar2 <= uVar1 || uVar2 == 0xffffffffffffffff;
  }
  return false;
}

Assistant:

inline bool Path::HasExtension() const
	{
		size_t posdot = m_string.find_last_of( '.' );
		if( posdot != std::string::npos )
		{
			size_t posseperator = m_string.find_last_of( seperator );
			if( posseperator != std::string::npos && posseperator > posdot )
			{
				return false; // the dot is for a directory such as ./ or ../ or the path is malformed
			}
			size_t posaltseperator = m_string.find_last_of( altseperator );
			if( posaltseperator != std::string::npos && posaltseperator > posdot )
			{
				return false; // the dot is for a directory such as ./ or ../ or the path is malformed
			}
			return true;
		}
		return false;
	}